

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O3

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>::
ChContactNSC(ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
             *this,ChContactContainer *mcontainer,ChContactable_3vars<6,_6,_6> *mobjA,
            ChContactable_3vars<3,_3,_3> *mobjB,ChCollisionInfo *cinfo,ChMaterialCompositeNSC *mat)

{
  undefined1 auVar1 [32];
  
  ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>::
  ChContactTuple(&this->
                  super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
                 ,mcontainer,mobjA,mobjB,cinfo);
  (this->
  super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>)
  ._vptr_ChContactTuple = (_func_int **)&PTR__ChContactNSC_00b146d8;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.valid = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.disabled = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.redundant = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.broken = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.active = true;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_1 = (ChVariables *)0x0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_2 = (ChVariables *)0x0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_3 = (ChVariables *)0x0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_1 = (ChVariables *)0x0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_2 = (ChVariables *)0x0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_3 = (ChVariables *)0x0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b14838;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  *(undefined8 *)
   &(this->Nx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
    .field_0x238 = 0;
  *(undefined8 *)&(this->Nx).field_0x240 = 0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.valid = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.disabled = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.redundant = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.broken = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.active = true;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_3 = (ChVariables *)0x0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_1 = (ChVariables *)0x0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_2 = (ChVariables *)0x0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_1 = (ChVariables *)0x0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_2 = (ChVariables *)0x0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_3 = (ChVariables *)0x0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b149b8;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.valid = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.disabled = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.redundant = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.broken = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.active = true;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_1 = (ChVariables *)0x0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_2 = (ChVariables *)0x0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.variables_3 = (ChVariables *)0x0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x10) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x18) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x20) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 0x28) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_a.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_3.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_1 = (ChVariables *)0x0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_2 = (ChVariables *)0x0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.variables_3 = (ChVariables *)0x0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
           .tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 8) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b149b8;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  (this->react_force).m_data[2] = 0.0;
  (this->react_force).m_data[0] = 0.0;
  (this->react_force).m_data[1] = 0.0;
  (this->Nx).constraint_U = &this->Tu;
  (this->Nx).constraint_V = &this->Tv;
  Reset(this,mobjA,mobjB,cinfo,mat);
  return;
}

Assistant:

ChContactNSC(ChContactContainer* mcontainer,           ///< contact container
                 Ta* mobjA,                                ///< collidable object A
                 Tb* mobjB,                                ///< collidable object B
                 const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
                 const ChMaterialCompositeNSC&  mat        ///< composite material
                 )
        : ChContactTuple<Ta, Tb>(mcontainer, mobjA, mobjB, cinfo) {
        Nx.SetTangentialConstraintU(&Tu);
        Nx.SetTangentialConstraintV(&Tv);

        Reset(mobjA, mobjB, cinfo, mat);
    }